

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O2

word * Sfm_NodeReadTruth(Sfm_Ntk_t *p,int i)

{
  int iVar1;
  word *pwVar2;
  Vec_Wrd_t *p_00;
  
  iVar1 = Sfm_ObjFaninNum(p,i);
  if (iVar1 < 7) {
    p_00 = p->vTruths;
  }
  else {
    p_00 = p->vTruths2;
    i = Vec_IntEntry(p->vStarts,i);
  }
  pwVar2 = Vec_WrdEntryP(p_00,i);
  return pwVar2;
}

Assistant:

word * Sfm_NodeReadTruth( Sfm_Ntk_t * p, int i )
{
    return Sfm_ObjFaninNum(p, i) <= 6 ? Vec_WrdEntryP( p->vTruths, i ) : Vec_WrdEntryP( p->vTruths2, Vec_IntEntry(p->vStarts, i) );
}